

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::io::anon_unknown_0::IoTest_FileReadError_Test::~IoTest_FileReadError_Test
          (IoTest_FileReadError_Test *this)

{
  IoTest_FileReadError_Test *this_local;
  
  ~IoTest_FileReadError_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F(IoTest, FileReadError) {
  MsvcDebugDisabler debug_disabler;

  // -1 = invalid file descriptor.
  FileInputStream input(-1);

  const void* buffer;
  int size;
  EXPECT_FALSE(input.Next(&buffer, &size));
  EXPECT_EQ(EBADF, input.GetErrno());
}